

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::CheckSecondFramebufferContent
          (FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  uint local_34;
  uint local_30;
  GLuint i;
  GLuint j;
  GLubyte framebuffer_values [3] [4];
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  framebuffer_values._4_8_ = CONCAT44(extraout_var,iVar1);
  (**(code **)(framebuffer_values._4_8_ + 0x78))(0x8d40,this->m_fbo_2nd);
  dVar2 = (**(code **)(framebuffer_values._4_8_ + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e01);
  memset(&i,0,0xc);
  (**(code **)(framebuffer_values._4_8_ + 0x1220))(0,0,4,3,0x1903,0x1401,&i);
  dVar2 = (**(code **)(framebuffer_values._4_8_ + 0x800))();
  glu::checkError(dVar2,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e0a);
  local_30 = 0;
  do {
    if (2 < local_30) {
      return true;
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if (CheckSecondFramebufferContent::reference_values[local_30][local_34] !=
          *(GLubyte *)((long)&i + (ulong)local_34 + (ulong)local_30 * 4)) {
        return false;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool FunctionalTest::CheckSecondFramebufferContent()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_2nd);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	glw::GLubyte framebuffer_values[3][4] = {
		{ 0 } /* , ... */
	};

	static const glw::GLubyte reference_values[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 255, 0 }, { 0, 0, 0, 0 } };

	gl.readPixels(0, 0, 4, 3, GL_RED, GL_UNSIGNED_BYTE, framebuffer_values);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	for (glw::GLuint j = 0; j < 3; ++j)
	{
		for (glw::GLuint i = 0; i < 4; ++i)
		{
			if (reference_values[j][i] != framebuffer_values[j][i])
			{
				return false;
			}
		}
	}

	return true;
}